

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_LogicalCountExprPrecedence_Test::~ExprWriterTest_LogicalCountExprPrecedence_Test
          (ExprWriterTest_LogicalCountExprPrecedence_Test *this)

{
  void *in_RDI;
  
  ~ExprWriterTest_LogicalCountExprPrecedence_Test
            ((ExprWriterTest_LogicalCountExprPrecedence_Test *)0x1354c8);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, LogicalCountExprPrecedence) {
  NumericExpr n0 = MakeConst(0), n1 = MakeConst(1), lhs = MakeConst(42);
  LogicalExpr args[] = {
    MakeRelational(ex::EQ, MakeVariable(0), MakeConst(0)), l1
  };
  auto count1 = MakeLogicalCount(ex::ATLEAST, lhs, MakeCount(args));
  LogicalExpr args2[] = {count1, l1};
  auto count2 = MakeCount(args2);
  CHECK_WRITE("if atleast 42 (atleast 42 (x1 = 0, 1), 1) then 1",
      MakeIf(MakeLogicalCount(ex::ATLEAST, lhs, count2), n1, n0));
  CHECK_WRITE("if atmost 42 (atleast 42 (x1 = 0, 1), 1) then 1",
      MakeIf(MakeLogicalCount(ex::ATMOST, lhs, count2), n1, n0));
  CHECK_WRITE("if exactly 42 (atleast 42 (x1 = 0, 1), 1) then 1",
      MakeIf(MakeLogicalCount(ex::EXACTLY, lhs, count2), n1, n0));
  CHECK_WRITE("if !atleast 42 (atleast 42 (x1 = 0, 1), 1) then 1",
      MakeIf(MakeLogicalCount(ex::NOT_ATLEAST, lhs, count2), n1, n0));
  CHECK_WRITE("if !atmost 42 (atleast 42 (x1 = 0, 1), 1) then 1",
      MakeIf(MakeLogicalCount(ex::NOT_ATMOST, lhs, count2), n1, n0));
  CHECK_WRITE("if !exactly 42 (atleast 42 (x1 = 0, 1), 1) then 1",
      MakeIf(MakeLogicalCount(ex::NOT_EXACTLY, lhs, count2), n1, n0));

  args2[0] = l0;
  auto count = MakeCount(args2);
  CHECK_WRITE("if atleast 42 (0, 1) || 0 then 1",
      MakeIf(MakeBinaryLogical(
               ex::OR, MakeLogicalCount(ex::ATLEAST, lhs, count), l0), n1, n0));
  CHECK_WRITE("if atmost 42 (0, 1) || 0 then 1",
      MakeIf(MakeBinaryLogical(
               ex::OR, MakeLogicalCount(ex::ATMOST, lhs, count), l0), n1, n0));
  CHECK_WRITE("if exactly 42 (0, 1) || 0 then 1",
      MakeIf(MakeBinaryLogical(
               ex::OR, MakeLogicalCount(ex::EXACTLY, lhs, count), l0), n1, n0));
  CHECK_WRITE("if !atleast 42 (0, 1) || 0 then 1",
      MakeIf(MakeBinaryLogical(
               ex::OR, MakeLogicalCount(ex::NOT_ATLEAST, lhs, count), l0),
             n1, n0));
  CHECK_WRITE("if !atmost 42 (0, 1) || 0 then 1",
      MakeIf(MakeBinaryLogical(
               ex::OR, MakeLogicalCount(ex::NOT_ATMOST, lhs, count), l0),
             n1, n0));
  CHECK_WRITE("if !exactly 42 (0, 1) || 0 then 1",
      MakeIf(MakeBinaryLogical(
               ex::OR, MakeLogicalCount(ex::NOT_EXACTLY, lhs, count), l0),
             n1, n0));
}